

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void lua_concat(lua_State *L,int n)

{
  byte bVar1;
  int iVar2;
  StkId pTVar3;
  int *piVar4;
  TString *pTVar5;
  char *__assertion;
  
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5ec,"void lua_concat(lua_State *, int)");
  }
  pTVar3 = L->top;
  if ((long)pTVar3 - (long)L->ci->func >> 4 <= (long)n) {
    __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                  ,0x5ed,"void lua_concat(lua_State *, int)");
  }
  if (n < 2) {
    if (n == 0) {
      pTVar5 = luaS_newlstr(L,"",0);
      if ((pTVar5->tt & 0xe) < 10) {
        (pTVar3->value_).gc = (GCObject *)pTVar5;
        bVar1 = pTVar5->tt;
        pTVar3->tt_ = bVar1 | 0x8000;
        if ((-1 < (char)bVar1) && ((pTVar5->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
          pTVar3 = L->top;
          L->top = pTVar3 + 1;
          if (L->ci->top < pTVar3 + 1) {
            __assert_fail("(L->top <= L->ci->top) && \"stack overflow\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                          ,0x5f3,"void lua_concat(lua_State *, int)");
          }
          goto LAB_00114e05;
        }
        __assertion = "0";
      }
      else {
        __assertion = "(((x_)->tt) & 0x0F) < (9+1)";
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                    ,0x5f2,"void lua_concat(lua_State *, int)");
    }
  }
  else {
    luaV_concat(L,n);
  }
LAB_00114e05:
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  piVar4 = *(int **)&L[-1].hookmask;
  *piVar4 = *piVar4 + -1;
  if (*piVar4 == 0) {
    return;
  }
  __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lapi.c"
                ,0x5f7,"void lua_concat(lua_State *, int)");
}

Assistant:

LUA_API void lua_concat (lua_State *L, int n) {
  lua_lock(L);
  api_checknelems(L, n);
  if (n >= 2) {
    luaV_concat(L, n);
  }
  else if (n == 0) {  /* push empty string */
    setsvalue2s(L, L->top, luaS_newlstr(L, "", 0));
    api_incr_top(L);
  }
  /* else n == 1; nothing to do */
  luaC_checkGC(L);
  lua_unlock(L);
}